

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void clearvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  GCObject *pGVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  Node *n;
  Table *h;
  
  for (; l != f; l = l[3].next) {
    bVar1 = l->field_0xb;
    lVar2 = *(long *)&l[1].tt;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < *(uint *)&l->field_0xc; uVar5 = uVar5 + 1) {
      pGVar3 = l[1].next;
      iVar4 = iscleared(g,(TValue *)((long)&pGVar3->next + lVar6));
      if (iVar4 != 0) {
        *(undefined4 *)(&pGVar3->tt + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    for (n = *(Node **)&l[1].tt; n < (Node *)(lVar2 + (long)(1 << (bVar1 & 0x1f)) * 0x20); n = n + 1
        ) {
      if ((n->i_val).tt_ != 0) {
        iVar4 = iscleared(g,&n->i_val);
        if (iVar4 != 0) {
          (n->i_val).tt_ = 0;
          removeentry(n);
        }
      }
    }
  }
  return;
}

Assistant:

static void clearvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, o))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && iscleared(g, gval(n))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}